

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::notifyAll(Player *this)

{
  list<Observer_*,_std::allocator<Observer_*>_> *this_00;
  bool bVar1;
  ostream *this_01;
  reference ppOVar2;
  Observer **observer;
  iterator __end1;
  iterator __begin1;
  list<Observer_*,_std::allocator<Observer_*>_> *__range1;
  Player *this_local;
  
  bVar1 = std::__cxx11::list<Observer_*,_std::allocator<Observer_*>_>::empty(this->pObservers);
  if (bVar1) {
    this_01 = std::operator<<((ostream *)&std::cout,
                              "[WARNING] - The current player has no observers currently attached to it."
                             );
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  else {
    this_00 = this->pObservers;
    __end1 = std::__cxx11::list<Observer_*,_std::allocator<Observer_*>_>::begin(this_00);
    observer = (Observer **)
               std::__cxx11::list<Observer_*,_std::allocator<Observer_*>_>::end(this_00);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&observer), bVar1) {
      ppOVar2 = std::_List_iterator<Observer_*>::operator*(&__end1);
      (**(*ppOVar2)->_vptr_Observer)();
      std::_List_iterator<Observer_*>::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Player::notifyAll() {
    if(this->pObservers->empty()) {
        std::cout << "[WARNING] - The current player has no observers currently attached to it." << std::endl;
        return;
    }
    for(const auto& observer : *this->pObservers) {
        observer->update();
    }
}